

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Bool(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
       *this,bool b)

{
  byte b_00;
  byte in_SIL;
  Stack<rapidjson::CrtAllocator> *in_RDI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *ret
  ;
  char **ppcVar1;
  undefined7 in_stack_ffffffffffffffb8;
  Stack<rapidjson::CrtAllocator> *this_00;
  
  b_00 = in_SIL & 1;
  ppcVar1 = &in_RDI->stackEnd_;
  this_00 = in_RDI;
  if ((CrtAllocator *)in_RDI[1].stack_ < in_RDI[1].ownAllocator_ + 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (in_RDI,CONCAT17(in_SIL,in_stack_ffffffffffffffb8) & 0x1ffffffffffffff);
  }
  in_RDI[1].ownAllocator_ = in_RDI[1].ownAllocator_ + 0x10;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue<bool>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)this_00,(bool)b_00,ppcVar1);
  return true;
}

Assistant:

bool Bool(bool b) { new (stack_.template Push<ValueType>()) ValueType(b); return true; }